

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLDeclaration * __thiscall tinyxml2::XMLDocument::NewDeclaration(XMLDocument *this,char *str)

{
  int iVar1;
  undefined4 extraout_var;
  char *str_00;
  XMLNode *pXVar2;
  
  iVar1 = (*(this->_commentPool).super_MemPool._vptr_MemPool[3])(&this->_commentPool);
  pXVar2 = (XMLNode *)CONCAT44(extraout_var,iVar1);
  pXVar2->_document = this;
  pXVar2->_parent = (XMLNode *)0x0;
  (pXVar2->_value)._flags = 0;
  (pXVar2->_value)._start = (char *)0x0;
  (pXVar2->_value)._end = (char *)0x0;
  pXVar2->_parseLineNum = 0;
  pXVar2->_userData = (void *)0x0;
  pXVar2->_memPool = (MemPool *)0x0;
  pXVar2->_firstChild = (XMLNode *)0x0;
  pXVar2->_lastChild = (XMLNode *)0x0;
  pXVar2->_prev = (XMLNode *)0x0;
  pXVar2->_next = (XMLNode *)0x0;
  ((XMLNode *)&pXVar2->_vptr_XMLNode)->_vptr_XMLNode = (_func_int **)&PTR_ToElement_0027f760;
  pXVar2->_memPool = &(this->_commentPool).super_MemPool;
  DynArray<tinyxml2::XMLNode_*,_10>::EnsureCapacity(&this->_unlinked,(this->_unlinked)._size + 1);
  iVar1 = (this->_unlinked)._size;
  (this->_unlinked)._mem[iVar1] = pXVar2;
  (this->_unlinked)._size = iVar1 + 1;
  str_00 = "xml version=\"1.0\" encoding=\"UTF-8\"";
  if (str != (char *)0x0) {
    str_00 = str;
  }
  StrPair::SetStr(&pXVar2->_value,str_00,0);
  return (XMLDeclaration *)pXVar2;
}

Assistant:

XMLDeclaration* XMLDocument::NewDeclaration( const char* str )
{
    XMLDeclaration* dec = CreateUnlinkedNode<XMLDeclaration>( _commentPool );
    dec->SetValue( str ? str : "xml version=\"1.0\" encoding=\"UTF-8\"" );
    return dec;
}